

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::WriteBuildFileTop(cmLocalNinjaGenerator *this)

{
  pointer pbVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *os;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  cmLocalNinjaGenerator *this_00;
  cmGlobalGenerator *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  pointer config_00;
  undefined4 extraout_var_00;
  
  iVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x44])();
  WriteProjectHeader(this,(ostream *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[0x44])();
    WriteNinjaRequiredVersion(this,(ostream *)CONCAT44(extraout_var_01,iVar2));
    pcVar3 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
    iVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x44])();
    WriteNinjaConfigurationVariable
              ((cmLocalNinjaGenerator *)pcVar3,(ostream *)CONCAT44(extraout_var_02,iVar2),
               (this->super_cmLocalCommonGenerator).ConfigNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    pbVar1 = (this->super_cmLocalCommonGenerator).ConfigNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (config_00 = (this->super_cmLocalCommonGenerator).ConfigNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; config_00 != pbVar1;
        config_00 = config_00 + 1) {
      pcVar3 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
      iVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x41])(pcVar3,config_00);
      os = (ostream *)CONCAT44(extraout_var_00,iVar2);
      WriteProjectHeader(this,os);
      this_00 = this;
      WriteNinjaRequiredVersion(this,os);
      WriteNinjaConfigurationVariable(this_00,os,config_00);
      WriteNinjaFilesInclusionConfig(this,os);
    }
  }
  iVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x44])();
  WriteNinjaFilesInclusionCommon(this,(ostream *)CONCAT44(extraout_var_03,iVar2));
  iVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x44])();
  WriteNinjaWorkDir(this,(ostream *)CONCAT44(extraout_var_04,iVar2));
  WriteProjectHeader(this,(ostream *)
                          (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          GlobalGenerator[1].Makefiles.
                          super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteBuildFileTop()
{
  this->WriteProjectHeader(this->GetCommonFileStream());

  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    for (auto const& config : this->GetConfigNames()) {
      auto& stream = this->GetImplFileStream(config);
      this->WriteProjectHeader(stream);
      this->WriteNinjaRequiredVersion(stream);
      this->WriteNinjaConfigurationVariable(stream, config);
      this->WriteNinjaFilesInclusionConfig(stream);
    }
  } else {
    this->WriteNinjaRequiredVersion(this->GetCommonFileStream());
    this->WriteNinjaConfigurationVariable(this->GetCommonFileStream(),
                                          this->GetConfigNames().front());
  }
  this->WriteNinjaFilesInclusionCommon(this->GetCommonFileStream());
  this->WriteNinjaWorkDir(this->GetCommonFileStream());

  // For the rule file.
  this->WriteProjectHeader(this->GetRulesFileStream());
}